

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fast-dtoa.cc
# Opt level: O3

void TestFastDtoaPrecisionVariousDoubles(void)

{
  long lVar1;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  size_t sVar6;
  char *pcVar7;
  ulong uVar8;
  undefined8 uVar9;
  char *pcVar10;
  undefined8 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  Vector<char> buffer;
  Vector<char> buffer_00;
  Vector<char> buffer_01;
  Vector<char> buffer_02;
  Vector<char> buffer_03;
  Vector<char> buffer_04;
  Vector<char> buffer_05;
  Vector<char> buffer_06;
  Vector<char> buffer_07;
  Vector<char> buffer_08;
  Vector<char> buffer_09;
  Vector<char> buffer_10;
  Vector<char> buffer_11;
  int point;
  int length;
  char buffer_container [100];
  int *in_stack_ffffffffffffff78;
  undefined8 uVar20;
  int local_80;
  undefined4 local_7c;
  char local_78 [4];
  char cStack_74;
  char cStack_73;
  char cStack_72;
  char cStack_71;
  char cStack_70;
  char cStack_6f;
  char cStack_6e;
  char cStack_6d;
  char cStack_6c;
  char cStack_6b;
  char cStack_6a;
  char cStack_69;
  char local_68;
  char cStack_67;
  char cStack_66;
  
  buffer._8_8_ = &local_7c;
  buffer.start_ = (char *)0x64;
  bVar2 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,1.0,FAST_DTOA_PRECISION|FAST_DTOA_SHORTEST_SINGLE,
                     (int)local_78,buffer,&local_80,in_stack_ffffffffffffff78);
  if (!bVar2) {
    pcVar7 = "status";
    uVar9 = 0xd1;
    goto LAB_00864315;
  }
  if (3 < local_7c) {
    pcVar7 = "3 >= length";
    uVar9 = 0xd2;
    goto LAB_00864315;
  }
  sVar6 = strlen(local_78);
  uVar3 = (uint)sVar6;
  uVar8 = sVar6 & 0xffffffff;
  uVar4 = uVar3 + 1;
  do {
    uVar5 = (int)uVar3 >> 0x1f & uVar3;
    if ((int)uVar8 < 1) break;
    uVar4 = uVar4 - 1;
    lVar1 = uVar8 - 1;
    uVar8 = uVar8 - 1;
    uVar5 = uVar4;
  } while (local_78[lVar1] == '0');
  local_78[(int)uVar5] = '\0';
  if (CONCAT11(local_78[1],local_78[0]) != 0x31) {
    pcVar7 = "\"1\"";
    pcVar10 = "1";
    uVar9 = 0xd4;
    goto LAB_0086434d;
  }
  if (local_80 != 1) {
    uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    uVar9 = 0xd5;
LAB_008642f0:
    pcVar7 = "1";
    uVar11 = 1;
    goto LAB_00864383;
  }
  buffer_00._8_8_ = &local_7c;
  buffer_00.start_ = (char *)0x64;
  bVar2 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,1.5,10,(int)local_78,buffer_00,&local_80,
                     in_stack_ffffffffffffff78);
  if (bVar2) {
    if (10 < local_7c) {
      pcVar7 = "10 >= length";
      uVar9 = 0xd9;
      goto LAB_00864315;
    }
    sVar6 = strlen(local_78);
    uVar3 = (uint)sVar6;
    uVar8 = sVar6 & 0xffffffff;
    uVar4 = uVar3 + 1;
    do {
      uVar5 = (int)uVar3 >> 0x1f & uVar3;
      if ((int)uVar8 < 1) break;
      uVar4 = uVar4 - 1;
      lVar1 = uVar8 - 1;
      uVar8 = uVar8 - 1;
      uVar5 = uVar4;
    } while (local_78[lVar1] == '0');
    local_78[(int)uVar5] = '\0';
    if (local_78[2] != '\0' || CONCAT11(local_78[1],local_78[0]) != 0x3531) {
      pcVar7 = "\"15\"";
      pcVar10 = "15";
      uVar9 = 0xdb;
      goto LAB_0086434d;
    }
    if (local_80 != 1) {
      uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
      uVar9 = 0xdc;
      goto LAB_008642f0;
    }
  }
  buffer_01._8_8_ = &local_7c;
  buffer_01.start_ = (char *)0x64;
  bVar2 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,4.94065645841247e-324,5,(int)local_78,buffer_01,
                     &local_80,in_stack_ffffffffffffff78);
  if (!bVar2) {
    pcVar7 = "status";
    uVar9 = 0xe2;
    goto LAB_00864315;
  }
  if (CONCAT11(cStack_73,cStack_74) != 0x37 ||
      CONCAT13(local_78[3],CONCAT12(local_78[2],CONCAT11(local_78[1],local_78[0]))) != 0x30343934) {
    pcVar7 = "\"49407\"";
    pcVar10 = "49407";
    uVar9 = 0xe3;
    goto LAB_0086434d;
  }
  if (local_80 != -0x143) {
    uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar7 = "-323";
    uVar9 = 0xe4;
    uVar11 = 0xfffffebd;
    goto LAB_00864383;
  }
  buffer_02._8_8_ = &local_7c;
  buffer_02.start_ = (char *)0x64;
  bVar2 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,1.79769313486232e+308,7,(int)local_78,buffer_02,
                     &local_80,in_stack_ffffffffffffff78);
  if (!bVar2) {
    pcVar7 = "status";
    uVar9 = 0xe9;
    goto LAB_00864315;
  }
  if (CONCAT17(cStack_71,
               CONCAT16(cStack_72,
                        CONCAT15(cStack_73,
                                 CONCAT14(cStack_74,
                                          CONCAT13(local_78[3],
                                                   CONCAT12(local_78[2],
                                                            CONCAT11(local_78[1],local_78[0])))))))
      != 0x33393637393731) {
    pcVar7 = "\"1797693\"";
    pcVar10 = "1797693";
    uVar9 = 0xea;
    goto LAB_0086434d;
  }
  if (local_80 != 0x135) {
    uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    pcVar7 = "309";
    uVar9 = 0xeb;
    uVar11 = 0x135;
    goto LAB_00864383;
  }
  buffer_03._8_8_ = &local_7c;
  buffer_03.start_ = (char *)0x64;
  bVar2 = double_conversion::FastDtoa
                    ((double_conversion *)0x2,4294967272.0,0xe,(int)local_78,buffer_03,&local_80,
                     in_stack_ffffffffffffff78);
  if (bVar2) {
    if (0xe < local_7c) {
      pcVar7 = "14 >= length";
      uVar9 = 0xf0;
      goto LAB_00864315;
    }
    sVar6 = strlen(local_78);
    uVar3 = (uint)sVar6;
    uVar8 = sVar6 & 0xffffffff;
    uVar4 = uVar3 + 1;
    do {
      uVar5 = (int)uVar3 >> 0x1f & uVar3;
      if ((int)uVar8 < 1) break;
      uVar4 = uVar4 - 1;
      lVar1 = uVar8 - 1;
      uVar8 = uVar8 - 1;
      uVar5 = uVar4;
    } while (local_78[lVar1] == '0');
    local_78[(int)uVar5] = '\0';
    if (CONCAT17(cStack_6e,
                 CONCAT16(cStack_6f,
                          CONCAT15(cStack_70,
                                   CONCAT14(cStack_71,
                                            CONCAT13(cStack_72,
                                                     CONCAT12(cStack_73,
                                                              CONCAT11(cStack_74,local_78[3])))))))
        != 0x32373237363934 ||
        CONCAT17(cStack_71,
                 CONCAT16(cStack_72,
                          CONCAT15(cStack_73,
                                   CONCAT14(cStack_74,
                                            CONCAT13(local_78[3],
                                                     CONCAT12(local_78[2],
                                                              CONCAT11(local_78[1],local_78[0]))))))
                ) != 0x3237363934393234) {
      pcVar7 = "\"4294967272\"";
      pcVar10 = "4294967272";
      uVar9 = 0xf2;
      goto LAB_0086434d;
    }
    if (local_80 == 10) goto LAB_00863901;
    uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
    uVar9 = 0xf3;
LAB_0086437d:
    pcVar7 = "10";
    uVar11 = 10;
  }
  else {
LAB_00863901:
    buffer_04._8_8_ = &local_7c;
    buffer_04.start_ = (char *)0x64;
    bVar2 = double_conversion::FastDtoa
                      ((double_conversion *)0x2,4.185580496821357e+298,0x11,(int)local_78,buffer_04,
                       &local_80,in_stack_ffffffffffffff78);
    if (!bVar2) {
      pcVar7 = "status";
      uVar9 = 0xf8;
      goto LAB_00864315;
    }
    auVar12[0] = -(local_78[0] == '4');
    auVar12[1] = -(local_78[1] == '1');
    auVar12[2] = -(local_78[2] == '8');
    auVar12[3] = -(local_78[3] == '5');
    auVar12[4] = -(cStack_74 == '5');
    auVar12[5] = -(cStack_73 == '8');
    auVar12[6] = -(cStack_72 == '0');
    auVar12[7] = -(cStack_71 == '4');
    auVar12[8] = -(cStack_70 == '9');
    auVar12[9] = -(cStack_6f == '6');
    auVar12[10] = -(cStack_6e == '8');
    auVar12[0xb] = -(cStack_6d == '2');
    auVar12[0xc] = -(cStack_6c == '1');
    auVar12[0xd] = -(cStack_6b == '3');
    auVar12[0xe] = -(cStack_6a == '5');
    auVar12[0xf] = -(cStack_69 == '6');
    auVar16[0] = -((char)_local_68 == '7');
    auVar16[1] = -((char)((ushort)_local_68 >> 8) == '\0');
    auVar16[2] = 0xff;
    auVar16[3] = 0xff;
    auVar16[4] = 0xff;
    auVar16[5] = 0xff;
    auVar16[6] = 0xff;
    auVar16[7] = 0xff;
    auVar16[8] = 0xff;
    auVar16[9] = 0xff;
    auVar16[10] = 0xff;
    auVar16[0xb] = 0xff;
    auVar16[0xc] = 0xff;
    auVar16[0xd] = 0xff;
    auVar16[0xe] = 0xff;
    auVar16[0xf] = 0xff;
    auVar16 = auVar16 & auVar12;
    if ((ushort)((ushort)(SUB161(auVar16 >> 7,0) & 1) | (ushort)(SUB161(auVar16 >> 0xf,0) & 1) << 1
                 | (ushort)(SUB161(auVar16 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar16 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar16 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar16 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar16 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar16 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar16 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar16 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar16 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar16 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar16 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar16 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar16 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar16[0xf] >> 7) << 0xf) != 0xffff) {
      pcVar7 = "\"41855804968213567\"";
      pcVar10 = "41855804968213567";
      uVar9 = 0xf9;
LAB_0086434d:
      printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %s\n#  Found:    %s\n",
             "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
             ,uVar9,pcVar7,"buffer.start()",pcVar10,local_78);
      abort();
    }
    if (local_80 == 299) {
      buffer_05._8_8_ = &local_7c;
      buffer_05.start_ = (char *)0x64;
      bVar2 = double_conversion::FastDtoa
                        ((double_conversion *)0x2,5.562684646268003e-309,FAST_DTOA_SHORTEST_SINGLE,
                         (int)local_78,buffer_05,&local_80,in_stack_ffffffffffffff78);
      if (!bVar2) {
        pcVar7 = "status";
        uVar9 = 0xfe;
        goto LAB_00864315;
      }
      if (CONCAT11(local_78[1],local_78[0]) != 0x36) {
        pcVar7 = "\"6\"";
        pcVar10 = "6";
        uVar9 = 0xff;
        goto LAB_0086434d;
      }
      if (local_80 != -0x134) {
        uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
        pcVar7 = "-308";
        uVar9 = 0x100;
        uVar11 = 0xfffffecc;
        goto LAB_00864383;
      }
      buffer_06._8_8_ = &local_7c;
      buffer_06.start_ = (char *)0x64;
      bVar2 = double_conversion::FastDtoa
                        ((double_conversion *)0x2,2147483648.0,5,(int)local_78,buffer_06,&local_80,
                         in_stack_ffffffffffffff78);
      if (!bVar2) {
        pcVar7 = "status";
        uVar9 = 0x104;
        goto LAB_00864315;
      }
      if (CONCAT11(cStack_73,cStack_74) != 0x35 ||
          CONCAT13(local_78[3],CONCAT12(local_78[2],CONCAT11(local_78[1],local_78[0]))) !=
          0x37343132) {
        pcVar7 = "\"21475\"";
        pcVar10 = "21475";
        uVar9 = 0x105;
        goto LAB_0086434d;
      }
      if (local_80 != 10) {
        uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
        uVar9 = 0x106;
        goto LAB_0086437d;
      }
      buffer_07._8_8_ = &local_7c;
      buffer_07.start_ = (char *)0x64;
      bVar2 = double_conversion::FastDtoa
                        ((double_conversion *)0x2,3.5844466002796428e+298,10,(int)local_78,buffer_07
                         ,&local_80,in_stack_ffffffffffffff78);
      if (!bVar2) {
        pcVar7 = "status";
        uVar9 = 0x10a;
LAB_00864315:
        printf("%s:%d:\n CHECK(%s) failed\n",
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
               ,uVar9,pcVar7);
        abort();
      }
      if (10 < local_7c) {
        pcVar7 = "10 >= length";
        uVar9 = 0x10b;
        goto LAB_00864315;
      }
      sVar6 = strlen(local_78);
      uVar3 = (uint)sVar6;
      uVar8 = sVar6 & 0xffffffff;
      uVar4 = uVar3 + 1;
      do {
        uVar5 = (int)uVar3 >> 0x1f & uVar3;
        if ((int)uVar8 < 1) break;
        uVar4 = uVar4 - 1;
        lVar1 = uVar8 - 1;
        uVar8 = uVar8 - 1;
        uVar5 = uVar4;
      } while (local_78[lVar1] == '0');
      local_78[(int)uVar5] = '\0';
      if (cStack_70 != '\0' ||
          CONCAT17(cStack_71,
                   CONCAT16(cStack_72,
                            CONCAT15(cStack_73,
                                     CONCAT14(cStack_74,
                                              CONCAT13(local_78[3],
                                                       CONCAT12(local_78[2],
                                                                CONCAT11(local_78[1],local_78[0]))))
                                    ))) != 0x3636343434383533) {
        pcVar7 = "\"35844466\"";
        pcVar10 = "35844466";
        uVar9 = 0x10d;
        goto LAB_0086434d;
      }
      if (local_80 == 299) {
        buffer_08._8_8_ = &local_7c;
        buffer_08.start_ = (char *)0x64;
        bVar2 = double_conversion::FastDtoa
                          ((double_conversion *)0x2,2.2250738585072014e-308,0x11,(int)local_78,
                           buffer_08,&local_80,in_stack_ffffffffffffff78);
        if (!bVar2) {
          pcVar7 = "status";
          uVar9 = 0x113;
          goto LAB_00864315;
        }
        auVar13[0] = -(local_78[0] == '2');
        auVar13[1] = -(local_78[1] == '2');
        auVar13[2] = -(local_78[2] == '2');
        auVar13[3] = -(local_78[3] == '5');
        auVar13[4] = -(cStack_74 == '0');
        auVar13[5] = -(cStack_73 == '7');
        auVar13[6] = -(cStack_72 == '3');
        auVar13[7] = -(cStack_71 == '8');
        auVar13[8] = -(cStack_70 == '5');
        auVar13[9] = -(cStack_6f == '8');
        auVar13[10] = -(cStack_6e == '5');
        auVar13[0xb] = -(cStack_6d == '0');
        auVar13[0xc] = -(cStack_6c == '7');
        auVar13[0xd] = -(cStack_6b == '2');
        auVar13[0xe] = -(cStack_6a == '0');
        auVar13[0xf] = -(cStack_69 == '1');
        auVar17[0] = -((char)_local_68 == '4');
        auVar17[1] = -((char)((ushort)_local_68 >> 8) == '\0');
        auVar17[2] = 0xff;
        auVar17[3] = 0xff;
        auVar17[4] = 0xff;
        auVar17[5] = 0xff;
        auVar17[6] = 0xff;
        auVar17[7] = 0xff;
        auVar17[8] = 0xff;
        auVar17[9] = 0xff;
        auVar17[10] = 0xff;
        auVar17[0xb] = 0xff;
        auVar17[0xc] = 0xff;
        auVar17[0xd] = 0xff;
        auVar17[0xe] = 0xff;
        auVar17[0xf] = 0xff;
        auVar17 = auVar17 & auVar13;
        if ((ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar17[0xf] >> 7) << 0xf) != 0xffff) {
          pcVar7 = "\"22250738585072014\"";
          pcVar10 = "22250738585072014";
          uVar9 = 0x114;
          goto LAB_0086434d;
        }
        if (local_80 == -0x133) {
          buffer_09._8_8_ = &local_7c;
          buffer_09.start_ = (char *)0x64;
          bVar2 = double_conversion::FastDtoa
                            ((double_conversion *)0x2,2.225073858507201e-308,0x11,(int)local_78,
                             buffer_09,&local_80,in_stack_ffffffffffffff78);
          if (!bVar2) {
            pcVar7 = "status";
            uVar9 = 0x11a;
            goto LAB_00864315;
          }
          if (0x14 < local_7c) {
            pcVar7 = "20 >= length";
            uVar9 = 0x11b;
            goto LAB_00864315;
          }
          sVar6 = strlen(local_78);
          uVar3 = (uint)sVar6;
          uVar8 = sVar6 & 0xffffffff;
          uVar4 = uVar3 + 1;
          do {
            uVar5 = (int)uVar3 >> 0x1f & uVar3;
            if ((int)uVar8 < 1) break;
            uVar4 = uVar4 - 1;
            lVar1 = uVar8 - 1;
            uVar8 = uVar8 - 1;
            uVar5 = uVar4;
          } while (local_78[lVar1] == '0');
          local_78[(int)uVar5] = '\0';
          auVar14[0] = -(local_78[0] == '2');
          auVar14[1] = -(local_78[1] == '2');
          auVar14[2] = -(local_78[2] == '2');
          auVar14[3] = -(local_78[3] == '5');
          auVar14[4] = -(cStack_74 == '0');
          auVar14[5] = -(cStack_73 == '7');
          auVar14[6] = -(cStack_72 == '3');
          auVar14[7] = -(cStack_71 == '8');
          auVar14[8] = -(cStack_70 == '5');
          auVar14[9] = -(cStack_6f == '8');
          auVar14[10] = -(cStack_6e == '5');
          auVar14[0xb] = -(cStack_6d == '0');
          auVar14[0xc] = -(cStack_6c == '7');
          auVar14[0xd] = -(cStack_6b == '2');
          auVar14[0xe] = -(cStack_6a == '0');
          auVar14[0xf] = -(cStack_69 == '0');
          auVar18[0] = -((char)_local_68 == '9');
          auVar18[1] = -((char)((ushort)_local_68 >> 8) == '\0');
          auVar18[2] = 0xff;
          auVar18[3] = 0xff;
          auVar18[4] = 0xff;
          auVar18[5] = 0xff;
          auVar18[6] = 0xff;
          auVar18[7] = 0xff;
          auVar18[8] = 0xff;
          auVar18[9] = 0xff;
          auVar18[10] = 0xff;
          auVar18[0xb] = 0xff;
          auVar18[0xc] = 0xff;
          auVar18[0xd] = 0xff;
          auVar18[0xe] = 0xff;
          auVar18[0xf] = 0xff;
          auVar18 = auVar18 & auVar14;
          if ((ushort)((ushort)(SUB161(auVar18 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar18 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB161(auVar18 >> 0x17,0) & 1) << 2 |
                       (ushort)(SUB161(auVar18 >> 0x1f,0) & 1) << 3 |
                       (ushort)(SUB161(auVar18 >> 0x27,0) & 1) << 4 |
                       (ushort)(SUB161(auVar18 >> 0x2f,0) & 1) << 5 |
                       (ushort)(SUB161(auVar18 >> 0x37,0) & 1) << 6 |
                       (ushort)(SUB161(auVar18 >> 0x3f,0) & 1) << 7 |
                       (ushort)(SUB161(auVar18 >> 0x47,0) & 1) << 8 |
                       (ushort)(SUB161(auVar18 >> 0x4f,0) & 1) << 9 |
                       (ushort)(SUB161(auVar18 >> 0x57,0) & 1) << 10 |
                       (ushort)(SUB161(auVar18 >> 0x5f,0) & 1) << 0xb |
                       (ushort)(SUB161(auVar18 >> 0x67,0) & 1) << 0xc |
                       (ushort)(SUB161(auVar18 >> 0x6f,0) & 1) << 0xd |
                       (ushort)(SUB161(auVar18 >> 0x77,0) & 1) << 0xe |
                      (ushort)(byte)(auVar18[0xf] >> 7) << 0xf) != 0xffff) {
            pcVar7 = "\"22250738585072009\"";
            pcVar10 = "22250738585072009";
            uVar9 = 0x11d;
            goto LAB_0086434d;
          }
          if (local_80 == -0x133) {
            buffer_10._8_8_ = &local_7c;
            buffer_10.start_ = (char *)0x64;
            bVar2 = double_conversion::FastDtoa
                              ((double_conversion *)0x2,3.316133905216739e-237,0x12,(int)local_78,
                               buffer_10,&local_80,in_stack_ffffffffffffff78);
            if (!bVar2) {
              pcVar7 = "status";
              uVar9 = 0x122;
              goto LAB_00864315;
            }
            auVar19[0] = -(local_78[3] == '6');
            auVar19[1] = -(cStack_74 == '1');
            auVar19[2] = -(cStack_73 == '3');
            auVar19[3] = -(cStack_72 == '3');
            auVar19[4] = -(cStack_71 == '9');
            auVar19[5] = -(cStack_70 == '0');
            auVar19[6] = -(cStack_6f == '5');
            auVar19[7] = -(cStack_6e == '2');
            auVar19[8] = -(cStack_6d == '1');
            auVar19[9] = -(cStack_6c == '6');
            auVar19[10] = -(cStack_6b == '7');
            auVar19[0xb] = -(cStack_6a == '3');
            auVar19[0xc] = -(cStack_69 == '9');
            auVar19[0xd] = -(local_68 == '0');
            auVar19[0xe] = -(cStack_67 == '6');
            auVar19[0xf] = -(cStack_66 == '\0');
            auVar15[0] = -(local_78[0] == '3');
            auVar15[1] = -(local_78[1] == '3');
            auVar15[2] = -(local_78[2] == '1');
            auVar15[3] = -(local_78[3] == '6');
            auVar15[4] = -(cStack_74 == '1');
            auVar15[5] = -(cStack_73 == '3');
            auVar15[6] = -(cStack_72 == '3');
            auVar15[7] = -(cStack_71 == '9');
            auVar15[8] = -(cStack_70 == '0');
            auVar15[9] = -(cStack_6f == '5');
            auVar15[10] = -(cStack_6e == '2');
            auVar15[0xb] = -(cStack_6d == '1');
            auVar15[0xc] = -(cStack_6c == '6');
            auVar15[0xd] = -(cStack_6b == '7');
            auVar15[0xe] = -(cStack_6a == '3');
            auVar15[0xf] = -(cStack_69 == '9');
            auVar15 = auVar15 & auVar19;
            if ((ushort)((ushort)(SUB161(auVar15 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar15 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB161(auVar15 >> 0x17,0) & 1) << 2 |
                         (ushort)(SUB161(auVar15 >> 0x1f,0) & 1) << 3 |
                         (ushort)(SUB161(auVar15 >> 0x27,0) & 1) << 4 |
                         (ushort)(SUB161(auVar15 >> 0x2f,0) & 1) << 5 |
                         (ushort)(SUB161(auVar15 >> 0x37,0) & 1) << 6 |
                         (ushort)(SUB161(auVar15 >> 0x3f,0) & 1) << 7 |
                         (ushort)(SUB161(auVar15 >> 0x47,0) & 1) << 8 |
                         (ushort)(SUB161(auVar15 >> 0x4f,0) & 1) << 9 |
                         (ushort)(SUB161(auVar15 >> 0x57,0) & 1) << 10 |
                         (ushort)(SUB161(auVar15 >> 0x5f,0) & 1) << 0xb |
                         (ushort)(SUB161(auVar15 >> 0x67,0) & 1) << 0xc |
                         (ushort)(SUB161(auVar15 >> 0x6f,0) & 1) << 0xd |
                         (ushort)(SUB161(auVar15 >> 0x77,0) & 1) << 0xe |
                        (ushort)(byte)(auVar15[0xf] >> 7) << 0xf) != 0xffff) {
              pcVar7 = "\"331613390521673906\"";
              pcVar10 = "331613390521673906";
              uVar9 = 0x123;
              goto LAB_0086434d;
            }
            if (local_80 == -0xec) {
              buffer_11._8_8_ = &local_7c;
              buffer_11.start_ = (char *)0x64;
              bVar2 = double_conversion::FastDtoa
                                ((double_conversion *)0x2,7.98851839160081e+191,4,(int)local_78,
                                 buffer_11,&local_80,in_stack_ffffffffffffff78);
              if (!bVar2) {
                pcVar7 = "status";
                uVar9 = 0x128;
                goto LAB_00864315;
              }
              if (cStack_74 != '\0' ||
                  CONCAT13(local_78[3],CONCAT12(local_78[2],CONCAT11(local_78[1],local_78[0]))) !=
                  0x39383937) {
                pcVar7 = "\"7989\"";
                pcVar10 = "7989";
                uVar9 = 0x129;
                goto LAB_0086434d;
              }
              if (local_80 == 0xc0) {
                return;
              }
              uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
              pcVar7 = "192";
              uVar9 = 0x12a;
              uVar11 = 0xc0;
            }
            else {
              uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
              pcVar7 = "-236";
              uVar9 = 0x124;
              uVar11 = 0xffffff14;
            }
            goto LAB_00864383;
          }
          uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
          uVar9 = 0x11e;
        }
        else {
          uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
          uVar9 = 0x115;
        }
        pcVar7 = "-307";
        uVar11 = 0xfffffecd;
        goto LAB_00864383;
      }
      uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
      uVar9 = 0x10e;
    }
    else {
      uVar20 = CONCAT44((int)((ulong)in_stack_ffffffffffffff78 >> 0x20),local_80);
      uVar9 = 0xfa;
    }
    pcVar7 = "299";
    uVar11 = 299;
  }
LAB_00864383:
  printf("%s:%d:\n CHECK_EQ(%s, %s) failed\n#  Expected: %d\n#  Found:    %d\n",
         "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/double-conversion/test/cctest/test-fast-dtoa.cc"
         ,uVar9,pcVar7,"point",uVar11,uVar20);
  abort();
}

Assistant:

TEST(FastDtoaPrecisionVariousDoubles) {
  char buffer_container[kBufferSize];
  Vector<char> buffer(buffer_container, kBufferSize);
  int length;
  int point;
  bool status;

  status = FastDtoa(1.0, FAST_DTOA_PRECISION, 3, buffer, &length, &point);
  CHECK(status);
  CHECK(3 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("1", buffer.start());
  CHECK_EQ(1, point);

  status = FastDtoa(1.5, FAST_DTOA_PRECISION, 10, buffer, &length, &point);
  if (status) {
    CHECK(10 >= length);
    TrimRepresentation(buffer);
    CHECK_EQ("15", buffer.start());
    CHECK_EQ(1, point);
  }

  double min_double = 5e-324;
  status = FastDtoa(min_double, FAST_DTOA_PRECISION, 5,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("49407", buffer.start());
  CHECK_EQ(-323, point);

  double max_double = 1.7976931348623157e308;
  status = FastDtoa(max_double, FAST_DTOA_PRECISION, 7,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("1797693", buffer.start());
  CHECK_EQ(309, point);

  status = FastDtoa(4294967272.0, FAST_DTOA_PRECISION, 14,
                    buffer, &length, &point);
  if (status) {
    CHECK(14 >= length);
    TrimRepresentation(buffer);
    CHECK_EQ("4294967272", buffer.start());
    CHECK_EQ(10, point);
  }

  status = FastDtoa(4.1855804968213567e298, FAST_DTOA_PRECISION, 17,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("41855804968213567", buffer.start());
  CHECK_EQ(299, point);

  status = FastDtoa(5.5626846462680035e-309, FAST_DTOA_PRECISION, 1,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("6", buffer.start());
  CHECK_EQ(-308, point);

  status = FastDtoa(2147483648.0, FAST_DTOA_PRECISION, 5,
                    buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("21475", buffer.start());
  CHECK_EQ(10, point);

  status = FastDtoa(3.5844466002796428e+298, FAST_DTOA_PRECISION, 10,
                    buffer, &length, &point);
  CHECK(status);
  CHECK(10 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("35844466", buffer.start());
  CHECK_EQ(299, point);

  uint64_t smallest_normal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x00100000, 00000000);
  double v = Double(smallest_normal64).value();
  status = FastDtoa(v, FAST_DTOA_PRECISION, 17, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("22250738585072014", buffer.start());
  CHECK_EQ(-307, point);

  uint64_t largest_denormal64 = DOUBLE_CONVERSION_UINT64_2PART_C(0x000FFFFF, FFFFFFFF);
  v = Double(largest_denormal64).value();
  status = FastDtoa(v, FAST_DTOA_PRECISION, 17, buffer, &length, &point);
  CHECK(status);
  CHECK(20 >= length);
  TrimRepresentation(buffer);
  CHECK_EQ("22250738585072009", buffer.start());
  CHECK_EQ(-307, point);

  v = 3.3161339052167390562200598e-237;
  status = FastDtoa(v, FAST_DTOA_PRECISION, 18, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("331613390521673906", buffer.start());
  CHECK_EQ(-236, point);

  v = 7.9885183916008099497815232e+191;
  status = FastDtoa(v, FAST_DTOA_PRECISION, 4, buffer, &length, &point);
  CHECK(status);
  CHECK_EQ("7989", buffer.start());
  CHECK_EQ(192, point);
}